

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O0

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand,int>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,int *val_3)

{
  reference this_00;
  reference this_01;
  undefined1 local_70 [8];
  instruction ins;
  int *val_local_3;
  operand *val_local_2;
  operand *val_local_1;
  operation *val_local;
  asmcode *this_local;
  
  ins.text.field_2._8_8_ = val_3;
  assembler::asmcode::instruction::instruction
            ((instruction *)local_70,*val,*val_1,*val_2,(long)*val_3);
  this_00 = std::
            vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
            ::back((vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
                    *)(this + 0x18));
  this_01 = std::
            _List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>
            ::operator*(this_00);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back(this_01,(instruction *)local_70);
  instruction::~instruction((instruction *)local_70);
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }